

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O3

void __thiscall Liby::UdpConnection::destroy(UdpConnection *this)

{
  UdpSocket *pUVar1;
  map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
  pVar2;
  Endpoint EStack_18;
  
  pUVar1 = this->socket_;
  if (pUVar1 != (UdpSocket *)0x0) {
    Endpoint::Endpoint(&EStack_18,&this->peer_);
    this_00 = &pUVar1->conns_;
    pVar2 = std::
            _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
            ::equal_range(&this_00->_M_t,&EStack_18);
    std::
    _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
    return;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,0x3a,"void Liby::UdpConnection::destroy()");
}

Assistant:

void UdpConnection::destroy() {
    assert(socket_);
    socket_->destroyConn(Endpoint(&peer_));
}